

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O1

MPP_RET __thiscall Mpp::control_osal(Mpp *this,MpiCmd cmd,MppParam param)

{
  if ((int)cmd < 0x100001) {
    _mpp_log_l(2,"mpp","Assertion %s failed at %s:%d\n",(char *)0x0,"cmd > MPP_OSAL_CMD_BASE",
               "control_osal",0x4cf);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001395f0;
  }
  if (0x100000 < (int)cmd) {
    _mpp_log_l(2,"mpp","Assertion %s failed at %s:%d\n",(char *)0x0,"cmd < MPP_OSAL_CMD_END",
               "control_osal",0x4d0);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_001395f0:
      abort();
    }
  }
  return MPP_NOK;
}

Assistant:

MPP_RET Mpp::control_osal(MpiCmd cmd, MppParam param)
{
    MPP_RET ret = MPP_NOK;

    mpp_assert(cmd > MPP_OSAL_CMD_BASE);
    mpp_assert(cmd < MPP_OSAL_CMD_END);

    (void)cmd;
    (void)param;
    return ret;
}